

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O1

void __thiscall ncnn::Convolution::~Convolution(Convolution *this)

{
  ~Convolution(this);
  operator_delete(this,0x140);
  return;
}

Assistant:

Convolution::~Convolution()
{
    delete quantize;
    delete dequantize;
}